

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O3

SQInteger __thiscall
SQTable::Next(SQTable *this,bool getweakrefs,SQObjectPtr *refpos,SQObjectPtr *outkey,
             SQObjectPtr *outval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQTable *pSVar4;
  SQWeakRef *pSVar5;
  SQObjectType SVar6;
  SQUnsignedInteger SVar7;
  SQObjectValue *pSVar8;
  long *plVar9;
  
  SVar7 = TranslateIndex(refpos);
  if ((long)SVar7 < this->_numofnodes) {
    pSVar8 = &this->_nodes[SVar7].key.super_SQObject._unVal;
    do {
      SVar7 = SVar7 + 1;
      if (((SQObject *)(pSVar8 + -1))->_type != OT_NULL) {
        SVar6 = (outkey->super_SQObject)._type;
        pSVar3 = (outkey->super_SQObject)._unVal.pTable;
        pSVar4 = pSVar8->pTable;
        (outkey->super_SQObject)._unVal.pTable = pSVar4;
        SVar2 = ((SQObject *)(pSVar8 + -1))->_type;
        (outkey->super_SQObject)._type = SVar2;
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar6 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        SVar6 = (SQObjectType)pSVar8[-3].fFloat;
        plVar9 = (long *)(pSVar8 + -2);
        if ((!getweakrefs) && (SVar6 == OT_WEAKREF)) {
          SVar6 = *(SQObjectType *)(*plVar9 + 0x18);
          plVar9 = (long *)(*plVar9 + 0x20);
        }
        pSVar5 = (SQWeakRef *)*plVar9;
        SVar2 = (outval->super_SQObject)._type;
        pSVar3 = (outval->super_SQObject)._unVal.pTable;
        (outval->super_SQObject)._unVal.pWeakRef = pSVar5;
        (outval->super_SQObject)._type = SVar6;
        if ((SVar6 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar5->super_SQRefCounted)._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar2 >> 0x1b & 1) == 0) {
          return SVar7;
        }
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 != 0) {
          return SVar7;
        }
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
        return SVar7;
      }
      pSVar8 = pSVar8 + 5;
    } while (SVar7 != this->_numofnodes);
  }
  return -1;
}

Assistant:

SQInteger SQTable::Next(bool getweakrefs,const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQInteger idx = (SQInteger)TranslateIndex(refpos);
    while (idx < _numofnodes) {
        if(sq_type(_nodes[idx].key) != OT_NULL) {
            //first found
            _HashNode &n = _nodes[idx];
            outkey = n.key;
            outval = getweakrefs?(SQObject)n.val:_realval(n.val);
            //return idx for the next iteration
            return ++idx;
        }
        ++idx;
    }
    //nothing to iterate anymore
    return -1;
}